

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O3

LogStream * __thiscall muduo::LogStream::operator<<(LogStream *this,void *p)

{
  char **ppcVar1;
  char cVar2;
  char *pcVar3;
  uintptr_t v;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  ppcVar1 = &(this->buffer_).cur_;
  pcVar3 = (this->buffer_).cur_;
  if (0x1f < (int)ppcVar1 - (int)pcVar3) {
    pcVar3[0] = '0';
    pcVar3[1] = 'x';
    uVar5 = 2;
    pcVar7 = pcVar3 + 1;
    do {
      pcVar6 = pcVar7;
      uVar4 = uVar5;
      uVar5 = uVar4 + 1;
      pcVar6[1] = "0123456789ABCDEF"[(uint)p & 0xf];
      pcVar7 = pcVar6 + 1;
      bVar8 = (void *)0xf < p;
      p = (void *)((ulong)p >> 4);
    } while (bVar8);
    pcVar6[2] = '\0';
    if (2 < uVar4) {
      pcVar3 = pcVar3 + 3;
      do {
        cVar2 = pcVar3[-1];
        pcVar3[-1] = *pcVar7;
        *pcVar7 = cVar2;
        pcVar7 = pcVar7 + -1;
        bVar8 = pcVar3 < pcVar7;
        pcVar3 = pcVar3 + 1;
      } while (bVar8);
    }
    *ppcVar1 = *ppcVar1 + uVar5;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(const void* p)
{
  uintptr_t v = reinterpret_cast<uintptr_t>(p);
  if (buffer_.avail() >= kMaxNumericSize)
  {
    char* buf = buffer_.current();
    buf[0] = '0';
    buf[1] = 'x';
    size_t len = convertHex(buf+2, v);
    buffer_.add(len+2);
  }
  return *this;
}